

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Codec.cpp
# Opt level: O0

int higan::Codec::HexCharToInt(char character)

{
  int local_10;
  int result;
  char character_local;
  
  local_10 = -1;
  if ((character < 'a') || ('f' < character)) {
    if ((character < 'A') || ('F' < character)) {
      if (('/' < character) && (character < ':')) {
        local_10 = character + -0x30;
      }
    }
    else {
      local_10 = character + -0x37;
    }
  }
  else {
    local_10 = character + -0x57;
  }
  return local_10;
}

Assistant:

int Codec::HexCharToInt(char character)
{
	int result = -1;
	if (character >= 'a' && character <= 'f')
	{
		result = character - 'a' + 10;
	}
	else if (character >= 'A' && character <= 'F')
	{
		result = character - 'A' + 10;
	}
	else if (character >= '0' && character <= '9')
	{
		result = character - '0';
	}
	return result;
}